

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Glucose::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  ClauseAllocator *this_00;
  byte bVar1;
  uint uVar2;
  VarData *pVVar3;
  uint *puVar4;
  lbool *plVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  byte bVar12;
  int iVar13;
  ulong uVar14;
  vec<Glucose::Solver::Watcher> *pvVar15;
  long lVar16;
  long lVar17;
  
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(&this->watches);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(&this->watchesBin);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(&this->unaryWatches);
  if (0 < (this->vardata).sz) {
    this_00 = &this->ca;
    lVar9 = 0;
    do {
      uVar14 = 0;
      bVar6 = true;
      do {
        bVar7 = bVar6;
        uVar14 = uVar14 | lVar9 * 2;
        pvVar15 = (this->watches).occs.data;
        if (0 < pvVar15[uVar14].sz) {
          pvVar15 = pvVar15 + uVar14;
          lVar16 = 0;
          lVar17 = 0;
          do {
            ClauseAllocator::reloc(this_00,(CRef *)((long)&pvVar15->data->cref + lVar16),to);
            lVar17 = lVar17 + 1;
            lVar16 = lVar16 + 8;
          } while (lVar17 < pvVar15->sz);
        }
        pvVar15 = (this->watchesBin).occs.data;
        if (0 < pvVar15[uVar14].sz) {
          pvVar15 = pvVar15 + uVar14;
          lVar16 = 0;
          lVar17 = 0;
          do {
            ClauseAllocator::reloc(this_00,(CRef *)((long)&pvVar15->data->cref + lVar16),to);
            lVar17 = lVar17 + 1;
            lVar16 = lVar16 + 8;
          } while (lVar17 < pvVar15->sz);
        }
        pvVar15 = (this->unaryWatches).occs.data;
        if (0 < pvVar15[uVar14].sz) {
          pvVar15 = pvVar15 + uVar14;
          lVar16 = 0;
          lVar17 = 0;
          do {
            ClauseAllocator::reloc(this_00,(CRef *)((long)&pvVar15->data->cref + lVar16),to);
            lVar17 = lVar17 + 1;
            lVar16 = lVar16 + 8;
          } while (lVar17 < pvVar15->sz);
        }
        uVar14 = 1;
        bVar6 = false;
      } while (bVar7);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->vardata).sz);
  }
  iVar8 = (this->trail).sz;
  if (0 < iVar8) {
    lVar9 = 0;
    do {
      pVVar3 = (this->vardata).data;
      iVar10 = (this->trail).data[lVar9].x >> 1;
      uVar2 = pVVar3[iVar10].reason;
      uVar14 = (ulong)uVar2;
      if (uVar14 != 0xffffffff) {
        puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        if ((char)*(undefined8 *)(puVar4 + uVar14) < '\0') {
LAB_00112396:
          ClauseAllocator::reloc(&this->ca,&pVVar3[iVar10].reason,to);
          iVar8 = (this->trail).sz;
        }
        else {
          iVar13 = (int)puVar4[uVar14 + 3] >> 1;
          bVar12 = (byte)puVar4[uVar14 + 3] & 1;
          plVar5 = (this->assigns).data;
          bVar1 = plVar5[iVar13].value;
          if ((int)((ulong)*(undefined8 *)(puVar4 + uVar14) >> 0x20) < 3) {
            if (((bVar1 == bVar12) && (pVVar3[iVar13].reason != 0xffffffff)) &&
               (pVVar3[iVar13].reason == uVar2)) goto LAB_00112396;
            iVar13 = (int)puVar4[uVar14 + 4] >> 1;
            if (plVar5[iVar13].value == ((byte)puVar4[uVar14 + 4] & 1)) {
              uVar11 = pVVar3[iVar13].reason;
              goto LAB_0011238d;
            }
          }
          else if (bVar1 == bVar12) {
            uVar11 = pVVar3[iVar13].reason;
LAB_0011238d:
            if ((uVar11 != 0xffffffff) && (uVar11 == uVar2)) goto LAB_00112396;
          }
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar8);
  }
  if (0 < (this->learnts).sz) {
    lVar16 = 0;
    lVar9 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->learnts).data + lVar16),to);
      lVar9 = lVar9 + 1;
      lVar16 = lVar16 + 4;
    } while (lVar9 < (this->learnts).sz);
  }
  if (0 < (this->permanentLearnts).sz) {
    lVar16 = 0;
    lVar9 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->permanentLearnts).data + lVar16),to);
      lVar9 = lVar9 + 1;
      lVar16 = lVar16 + 4;
    } while (lVar9 < (this->permanentLearnts).sz);
  }
  if (0 < (this->clauses).sz) {
    lVar16 = 0;
    lVar9 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->clauses).data + lVar16),to);
      lVar9 = lVar9 + 1;
      lVar16 = lVar16 + 4;
    } while (lVar9 < (this->clauses).sz);
  }
  if (0 < (this->unaryWatchedClauses).sz) {
    lVar16 = 0;
    lVar9 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->unaryWatchedClauses).data + lVar16),to)
      ;
      lVar9 = lVar9 + 1;
      lVar16 = lVar16 + 4;
    } while (lVar9 < (this->unaryWatchedClauses).sz);
  }
  return;
}

Assistant:

void Solver::relocAll(ClauseAllocator &to) {
    // All watchers:
    // for (int i = 0; i < watches.size(); i++)
    watches.cleanAll();
    watchesBin.cleanAll();
    unaryWatches.cleanAll();
    for(int v = 0; v < nVars(); v++)
        for(int s = 0; s < 2; s++) {
            Lit p = mkLit(v, s);
            // printf(" >>> RELOCING: %s%d\n", sign(p)?"-":"", var(p)+1);
            vec <Watcher> &ws = watches[p];
            for(int j = 0; j < ws.size(); j++)
                ca.reloc(ws[j].cref, to);
            vec <Watcher> &ws2 = watchesBin[p];
            for(int j = 0; j < ws2.size(); j++)
                ca.reloc(ws2[j].cref, to);
            vec <Watcher> &ws3 = unaryWatches[p];
            for(int j = 0; j < ws3.size(); j++)
                ca.reloc(ws3[j].cref, to);
        }

    // All reasons:
    //
    for(int i = 0; i < trail.size(); i++) {
        Var v = var(trail[i]);

        if(reason(v) != CRef_Undef && (ca[reason(v)].reloced() || locked(ca[reason(v)])))
            ca.reloc(vardata[v].reason, to);
    }

    // All learnt:
    //
    for(int i = 0; i < learnts.size(); i++)
        ca.reloc(learnts[i], to);

    for(int i = 0; i < permanentLearnts.size(); i++)
        ca.reloc(permanentLearnts[i], to);

    // All original:
    //
    for(int i = 0; i < clauses.size(); i++)
        ca.reloc(clauses[i], to);

    for(int i = 0; i < unaryWatchedClauses.size(); i++)
        ca.reloc(unaryWatchedClauses[i], to);
}